

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void startElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  xmlChar *pxVar1;
  xmlChar **ppxVar2;
  
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.startElement(%s",name);
  if ((atts != (xmlChar **)0x0) && (*atts != (xmlChar *)0x0)) {
    ppxVar2 = atts + 2;
    do {
      fprintf((FILE *)SAXdebug,", %s=\'");
      if (ppxVar2[-1] != (xmlChar *)0x0) {
        fprintf((FILE *)SAXdebug,"%s\'");
      }
      pxVar1 = *ppxVar2;
      ppxVar2 = ppxVar2 + 2;
    } while (pxVar1 != (xmlChar *)0x0);
  }
  fwrite(")\n",2,1,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
startElementDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, const xmlChar **atts)
{
    int i;

    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(SAXdebug, ", %s='", atts[i++]);
	    if (atts[i] != NULL)
	        fprintf(SAXdebug, "%s'", atts[i]);
	}
    }
    fprintf(SAXdebug, ")\n");
}